

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000219bd0 = 0x2e2e2e2e2e2e2e;
    uRam0000000000219bd7 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00219bc0 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000219bc8 = 0x2e2e2e2e2e2e2e;
    DAT_00219bcf = 0x2e;
    _DAT_00219bb0 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000219bb8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00219ba0 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000219ba8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000219b98 = 0x2e2e2e2e2e2e2e2e;
    DAT_00219bdf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }